

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_type_handler.h
# Opt level: O0

uint8_t * google::protobuf::internal::
          MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
          ::InternalSerialize(int field_number,
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                             *value,uint8_t *ptr,EpsCopyOutputStream *stream)

{
  uint32_t value_00;
  uint8_t *puVar1;
  EpsCopyOutputStream *stream_local;
  uint8_t *ptr_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key_local;
  int field_number_local;
  
  puVar1 = io::EpsCopyOutputStream::EnsureSpace(stream,ptr);
  puVar1 = WireFormatLite::WriteTagToArray(field_number,WIRETYPE_LENGTH_DELIMITED,puVar1);
  value_00 = GetCachedSize(key,value);
  puVar1 = io::CodedOutputStream::WriteVarint32ToArray(value_00,puVar1);
  puVar1 = MapTypeHandler<(google::protobuf::internal::WireFormatLite::FieldType)9,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::Write(1,key,puVar1,stream);
  puVar1 = MapTypeHandler<(google::protobuf::internal::WireFormatLite::FieldType)9,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::Write(2,value,puVar1,stream);
  return puVar1;
}

Assistant:

static uint8_t* InternalSerialize(int field_number, const Key& key,
                                    const Value& value, uint8_t* ptr,
                                    io::EpsCopyOutputStream* stream) {
    ptr = stream->EnsureSpace(ptr);
    ptr = WireFormatLite::WriteTagToArray(
        field_number, WireFormatLite::WIRETYPE_LENGTH_DELIMITED, ptr);
    ptr = io::CodedOutputStream::WriteVarint32ToArray(GetCachedSize(key, value),
                                                      ptr);

    ptr = KeyTypeHandler::Write(kKeyFieldNumber, key, ptr, stream);
    return ValueTypeHandler::Write(kValueFieldNumber, value, ptr, stream);
  }